

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

void __thiscall Game::printGameLost(Game *this)

{
  bool bVar1;
  reference piVar2;
  int *n;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  Game *this_local;
  
  std::operator<<((ostream *)&std::cout,"You lost. The number was: ");
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->referenceNumbers);
  n = (int *)std::vector<int,_std::allocator<int>_>::end(&this->referenceNumbers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &n);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  return;
}

Assistant:

void Game::printGameLost()
{
	std::cout << "You lost. The number was: ";
	for (auto&& n : referenceNumbers)
		std::cout << n;
	std::cout << '\n';
}